

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c++
# Opt level: O3

void __thiscall kj::TimerImpl::TimerImpl(TimerImpl *this,TimePoint startTime)

{
  _Rb_tree_header *p_Var1;
  Impl *pIVar2;
  
  (this->super_Timer).super_MonotonicClock._vptr_MonotonicClock = (_func_int **)&PTR_now_00625a20;
  (this->time).value.value = (long)startTime.value.value;
  pIVar2 = (Impl *)operator_new(0x30);
  p_Var1 = &(pIVar2->timers)._M_t._M_impl.super__Rb_tree_header;
  (pIVar2->timers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pIVar2->timers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  *(undefined8 *)&(pIVar2->timers)._M_t._M_impl = 0;
  *(undefined8 *)&(pIVar2->timers)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (pIVar2->timers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (pIVar2->timers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (pIVar2->timers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->impl).disposer = (Disposer *)&kj::_::HeapDisposer<kj::TimerImpl::Impl>::instance;
  (this->impl).ptr = pIVar2;
  (this->sleepHooks).ptr = (SleepHooks *)0x0;
  return;
}

Assistant:

TimerImpl::TimerImpl(TimePoint startTime)
    : time(startTime), impl(heap<Impl>()) {}